

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool WindowedKeyTest<Blob<450>,Blob<224>>
               (hashfunc<Blob<224>_> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  Blob<450> key;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_98;
  int local_78 [10];
  undefined8 uStack_4f;
  undefined8 uStack_47;
  
  uVar4 = 1 << (windowbits & 0x1fU);
  local_98.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize(&local_98,(long)(int)uVar4);
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x1c8,
         (ulong)(uint)windowbits,0x1c8);
  uVar1 = 1;
  if (1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  bVar3 = true;
  uVar4 = 0;
  do {
    local_78[8] = 0;
    stack0xffffffffffffffac = 0;
    uStack_4f = 0;
    uStack_47 = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    local_78[6] = 0;
    local_78[7] = 0;
    if (windowbits != 0x1f) {
      iVar5 = 0;
      lVar6 = 0;
      do {
        stack0xffffffffffffffac = 0;
        uStack_4f = 0;
        uStack_47 = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        local_78[8] = 0;
        local_78[0] = iVar5;
        lrot8(local_78,0x39,uVar4);
        (*hash.m_hash)(local_78,0x39,0,
                       (local_98.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                        super__Vector_impl_data._M_start)->bytes + lVar6);
        lVar6 = lVar6 + 0x1c;
        iVar5 = iVar5 + 1;
      } while ((ulong)uVar1 * 0x1c != lVar6);
    }
    printf("Window at %3d - ",(ulong)uVar4);
    bVar2 = TestHashList<Blob<224>>
                      (&local_98,drawDiagram,testCollision,testDistribution,false,false);
    bVar3 = (bool)(bVar3 & bVar2);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x1c9);
  if (local_98.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}